

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O0

CURLcode Curl_conn_tcp_listen_set(Curl_easy *data,connectdata *conn,int sockindex,curl_socket_t *s)

{
  uint *ctx_00;
  curltime cVar1;
  undefined4 uStack_44;
  cf_socket_ctx *ctx;
  Curl_cfilter *cf;
  uint *puStack_28;
  CURLcode result;
  curl_socket_t *s_local;
  connectdata *pcStack_18;
  int sockindex_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  ctx = (cf_socket_ctx *)0x0;
  puStack_28 = (uint *)s;
  s_local._4_4_ = sockindex;
  pcStack_18 = conn;
  conn_local = (connectdata *)data;
  Curl_conn_cf_discard_all(data,conn,sockindex);
  ctx_00 = (uint *)(*Curl_ccalloc)(1,0x180);
  if (ctx_00 == (uint *)0x0) {
    cf._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    *ctx_00 = (uint)pcStack_18->transport;
    ctx_00[0x26] = *puStack_28;
    *(byte *)(ctx_00 + 0x5f) = (byte)ctx_00[0x5f] & 0xfd;
    cf._4_4_ = Curl_cf_create((Curl_cfilter **)&ctx,&Curl_cft_tcp_accept,ctx_00);
    if (cf._4_4_ == CURLE_OK) {
      Curl_conn_cf_add((Curl_easy *)conn_local,pcStack_18,s_local._4_4_,(Curl_cfilter *)ctx);
      pcStack_18->sock[s_local._4_4_] = ctx_00[0x26];
      set_local_ip((Curl_cfilter *)ctx,(Curl_easy *)conn_local);
      *(byte *)(ctx_00 + 0x5f) = (byte)ctx_00[0x5f] & 0xf7 | 8;
      cVar1 = Curl_now();
      *(time_t *)(ctx_00 + 0x56) = cVar1.tv_sec;
      *(ulong *)(ctx_00 + 0x58) = CONCAT44(uStack_44,cVar1.tv_usec);
      (ctx->addr)._sa_ex_u.addr.sa_data[10] = (ctx->addr)._sa_ex_u.addr.sa_data[10] & 0xfeU | 1;
      if ((((conn_local != (connectdata *)0x0) &&
           ((*(ulong *)((long)&conn_local[2].options + 2) >> 0x1c & 1) != 0)) &&
          (ctx != (cf_socket_ctx *)0x0)) && (0 < *(int *)(*(long *)ctx + 0xc))) {
        Curl_trc_cf_infof((Curl_easy *)conn_local,(Curl_cfilter *)ctx,"Curl_conn_tcp_listen_set(%d)"
                          ,(ulong)ctx_00[0x26]);
      }
    }
  }
  if (cf._4_4_ != CURLE_OK) {
    (*Curl_cfree)(ctx);
    ctx = (cf_socket_ctx *)0x0;
    (*Curl_cfree)(ctx_00);
  }
  return cf._4_4_;
}

Assistant:

CURLcode Curl_conn_tcp_listen_set(struct Curl_easy *data,
                                  struct connectdata *conn,
                                  int sockindex, curl_socket_t *s)
{
  CURLcode result;
  struct Curl_cfilter *cf = NULL;
  struct cf_socket_ctx *ctx = NULL;

  /* replace any existing */
  Curl_conn_cf_discard_all(data, conn, sockindex);
  DEBUGASSERT(conn->sock[sockindex] == CURL_SOCKET_BAD);

  ctx = calloc(1, sizeof(*ctx));
  if(!ctx) {
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }
  ctx->transport = conn->transport;
  ctx->sock = *s;
  ctx->accepted = FALSE;
  result = Curl_cf_create(&cf, &Curl_cft_tcp_accept, ctx);
  if(result)
    goto out;
  Curl_conn_cf_add(data, conn, sockindex, cf);

  conn->sock[sockindex] = ctx->sock;
  set_local_ip(cf, data);
  ctx->active = TRUE;
  ctx->connected_at = Curl_now();
  cf->connected = TRUE;
  CURL_TRC_CF(data, cf, "Curl_conn_tcp_listen_set(%"
              CURL_FORMAT_SOCKET_T ")", ctx->sock);

out:
  if(result) {
    Curl_safefree(cf);
    Curl_safefree(ctx);
  }
  return result;
}